

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::AddDynamicProfileInfo<Memory::WriteBarrierPtr>
          (ScriptContext *this,FunctionBody *functionBody,
          WriteBarrierPtr<Js::DynamicProfileInfo> *dynamicProfileInfo)

{
  SourceDynamicProfileManager *this_00;
  code *pcVar1;
  WriteBarrierPtr<Js::DynamicProfileInfo> *functionBody_00;
  bool bVar2;
  uint32 uVar3;
  LocalFunctionId LVar4;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  DynamicProfileInfo **ppDVar7;
  SourceContextInfo *pSVar8;
  SourceDynamicProfileManager **ppSVar9;
  Cache *pCVar10;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> **ppSVar11;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *this_01;
  Recycler *pRVar12;
  SourceDynamicProfileManager *profileManager;
  SourceContextInfo *sourceContextInfo;
  DynamicProfileInfo *newDynamicProfileInfo;
  WriteBarrierPtr<Js::DynamicProfileInfo> *dynamicProfileInfo_local;
  FunctionBody *functionBody_local;
  ScriptContext *this_local;
  
  newDynamicProfileInfo = (DynamicProfileInfo *)dynamicProfileInfo;
  dynamicProfileInfo_local = (WriteBarrierPtr<Js::DynamicProfileInfo> *)functionBody;
  functionBody_local = (FunctionBody *)this;
  pSVar5 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  if (pSVar5 != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x161e,"(functionBody->GetScriptContext() == this)",
                                "functionBody->GetScriptContext() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = FunctionBody::HasValidSourceInfo((FunctionBody *)dynamicProfileInfo_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x161f,"(functionBody->HasValidSourceInfo())",
                                "functionBody->HasValidSourceInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ppDVar7 = Memory::WriteBarrierPtr::operator_cast_to_DynamicProfileInfo__
                      ((WriteBarrierPtr *)newDynamicProfileInfo);
  sourceContextInfo = (SourceContextInfo *)*ppDVar7;
  pSVar8 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)dynamicProfileInfo_local);
  ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_SourceDynamicProfileManager__
                      ((WriteBarrierPtr *)&pSVar8->sourceDynamicProfileManager);
  this_00 = *ppSVar9;
  bVar2 = SourceContextInfo::IsDynamic(pSVar8);
  if (bVar2) {
    if (this_00 == (SourceDynamicProfileManager *)0x0) {
      if (sourceContextInfo == (SourceContextInfo *)0x0) {
        sourceContextInfo =
             (SourceContextInfo *)
             FunctionBody::AllocateDynamicProfile((FunctionBody *)dynamicProfileInfo_local);
      }
      Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::operator=
                ((WriteBarrierPtr<Js::DynamicProfileInfo> *)newDynamicProfileInfo,
                 (DynamicProfileInfo *)sourceContextInfo);
    }
    else {
      if (sourceContextInfo == (SourceContextInfo *)0x0) {
        pRVar12 = GetRecycler(this);
        sourceContextInfo =
             (SourceContextInfo *)
             DynamicProfileInfo::New(pRVar12,(FunctionBody *)dynamicProfileInfo_local,true);
        LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)dynamicProfileInfo_local);
        SourceDynamicProfileManager::UpdateDynamicProfileInfo
                  (this_00,LVar4,(DynamicProfileInfo *)sourceContextInfo);
        Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::operator=
                  ((WriteBarrierPtr<Js::DynamicProfileInfo> *)newDynamicProfileInfo,
                   (DynamicProfileInfo *)sourceContextInfo);
      }
      LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)dynamicProfileInfo_local);
      SourceDynamicProfileManager::MarkAsExecuted(this_00,LVar4);
      functionBody_00 = dynamicProfileInfo_local;
      pSVar8 = sourceContextInfo;
      pRVar12 = GetRecycler(this);
      DynamicProfileInfo::UpdateFunctionInfo
                ((DynamicProfileInfo *)pSVar8,(FunctionBody *)functionBody_00,pRVar12);
    }
  }
  else {
    if (sourceContextInfo == (SourceContextInfo *)0x0) {
      sourceContextInfo =
           (SourceContextInfo *)
           FunctionBody::AllocateDynamicProfile((FunctionBody *)dynamicProfileInfo_local);
      Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::operator=
                ((WriteBarrierPtr<Js::DynamicProfileInfo> *)newDynamicProfileInfo,
                 (DynamicProfileInfo *)sourceContextInfo);
    }
    uVar3 = FunctionBody::GetInterpretedCount((FunctionBody *)dynamicProfileInfo_local);
    if (uVar3 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1643,"(functionBody->GetInterpretedCount() == 0)",
                                  "functionBody->GetInterpretedCount() == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pCVar10 = Cache(this);
    ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SListBase__
                         ((WriteBarrierPtr *)&pCVar10->profileInfoList);
    if (*ppSVar11 != (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
      pCVar10 = Cache(this);
      this_01 = Memory::
                WriteBarrierPtr<SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>_>::
                operator->(&pCVar10->profileInfoList);
      pRVar12 = GetRecycler(this);
      SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Prepend
                (this_01,pRVar12,(DynamicProfileInfo **)&sourceContextInfo);
    }
    if ((this->startupComplete & 1U) == 0) {
      if (this_00 == (SourceDynamicProfileManager *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x164d,"(profileManager)","profileManager");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)dynamicProfileInfo_local);
      SourceDynamicProfileManager::MarkAsExecuted(this_00,LVar4);
    }
  }
  ppDVar7 = Memory::WriteBarrierPtr::operator_cast_to_DynamicProfileInfo__
                      ((WriteBarrierPtr *)newDynamicProfileInfo);
  if (*ppDVar7 == (DynamicProfileInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x1651,"(dynamicProfileInfo != nullptr)",
                                "dynamicProfileInfo != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return;
}

Assistant:

void ScriptContext::AddDynamicProfileInfo(
        FunctionBody * functionBody, BarrierT<DynamicProfileInfo>& dynamicProfileInfo)
    {
        Assert(functionBody->GetScriptContext() == this);
        Assert(functionBody->HasValidSourceInfo());

        DynamicProfileInfo * newDynamicProfileInfo = dynamicProfileInfo;
        // If it is a dynamic script - we should create a profile info bound to the threadContext for its lifetime.
        SourceContextInfo* sourceContextInfo = functionBody->GetSourceContextInfo();
        SourceDynamicProfileManager* profileManager = sourceContextInfo->sourceDynamicProfileManager;
        if (sourceContextInfo->IsDynamic())
        {
            if (profileManager != nullptr)
            {
                // There is an in-memory cache and dynamic profile info is coming from there
                if (newDynamicProfileInfo == nullptr)
                {
                    newDynamicProfileInfo = DynamicProfileInfo::New(this->GetRecycler(), functionBody, true /* persistsAcrossScriptContexts */);
                    profileManager->UpdateDynamicProfileInfo(functionBody->GetLocalFunctionId(), newDynamicProfileInfo);
                    dynamicProfileInfo = newDynamicProfileInfo;
                }
                profileManager->MarkAsExecuted(functionBody->GetLocalFunctionId());
                newDynamicProfileInfo->UpdateFunctionInfo(functionBody, this->GetRecycler());
            }
            else
            {
                if (newDynamicProfileInfo == nullptr)
                {
                    newDynamicProfileInfo = functionBody->AllocateDynamicProfile();
                }
                dynamicProfileInfo = newDynamicProfileInfo;
            }
        }
        else
        {
            if (newDynamicProfileInfo == nullptr)
            {
                newDynamicProfileInfo = functionBody->AllocateDynamicProfile();
                dynamicProfileInfo = newDynamicProfileInfo;
            }
            Assert(functionBody->GetInterpretedCount() == 0);
#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)

            if (this->Cache()->profileInfoList)
            {
                this->Cache()->profileInfoList->Prepend(this->GetRecycler(), newDynamicProfileInfo);
            }
#endif
            if (!startupComplete)
            {
                Assert(profileManager);
                profileManager->MarkAsExecuted(functionBody->GetLocalFunctionId());
            }
        }
        Assert(dynamicProfileInfo != nullptr);
    }